

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::KNearestNeighborsClassifier::Clear(KNearestNeighborsClassifier *this)

{
  if (this->nearestneighborsindex_ != (NearestNeighborsIndex *)0x0) {
    (*(this->nearestneighborsindex_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->nearestneighborsindex_ = (NearestNeighborsIndex *)0x0;
  if (this->numberofneighbors_ != (Int64Parameter *)0x0) {
    (*(this->numberofneighbors_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->numberofneighbors_ = (Int64Parameter *)0x0;
  clear_ClassLabels(this);
  clear_DefaultClassLabel(this);
  clear_WeightingScheme(this);
  return;
}

Assistant:

void KNearestNeighborsClassifier::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.KNearestNeighborsClassifier)
  if (GetArenaNoVirtual() == NULL && nearestneighborsindex_ != NULL) {
    delete nearestneighborsindex_;
  }
  nearestneighborsindex_ = NULL;
  if (GetArenaNoVirtual() == NULL && numberofneighbors_ != NULL) {
    delete numberofneighbors_;
  }
  numberofneighbors_ = NULL;
  clear_ClassLabels();
  clear_DefaultClassLabel();
  clear_WeightingScheme();
}